

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.cpp
# Opt level: O3

void __thiscall Assimp::MD5::MD5Parser::MD5Parser(MD5Parser *this,char *_buffer,uint _fileSize)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  Logger *pLVar4;
  char szBuffer [128];
  Section local_a8;
  
  (this->mSections).super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mSections).super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mSections).super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((_buffer != (char *)0x0) && (_fileSize != 0)) {
    this->buffer = _buffer;
    this->fileSize = _fileSize;
    this->lineNumber = 0;
    pLVar4 = DefaultLogger::get();
    Logger::debug(pLVar4,"MD5Parser begin");
    ParseHeader(this);
    paVar1 = &local_a8.mName.field_2;
    paVar2 = &local_a8.mGlobalValue.field_2;
    do {
      local_a8.mName._M_string_length = 0;
      local_a8.mName.field_2._8_8_ = 0;
      local_a8.mGlobalValue._M_string_length = 0;
      local_a8.mGlobalValue.field_2._8_8_ = 0;
      local_a8.mElements.
      super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.mElements.
      super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8.iLineNumber = 0;
      local_a8._4_4_ = 0;
      local_a8.mElements.
      super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.mName.field_2._M_allocated_capacity = 0;
      local_a8.mGlobalValue.field_2._M_allocated_capacity = 0;
      local_a8.mName._M_dataplus._M_p = (pointer)paVar1;
      local_a8.mGlobalValue._M_dataplus._M_p = (pointer)paVar2;
      std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>::
      emplace_back<Assimp::MD5::Section>(&this->mSections,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.mGlobalValue._M_dataplus._M_p != paVar2) {
        operator_delete(local_a8.mGlobalValue._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.mName._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8.mName._M_dataplus._M_p);
      }
      if (local_a8.mElements.
          super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.mElements.
                        super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      bVar3 = ParseSection(this,(this->mSections).
                                super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -1);
    } while (bVar3);
    bVar3 = DefaultLogger::isNullLogger();
    if (!bVar3) {
      snprintf((char *)&local_a8,0x80,"MD5Parser end. Parsed %i sections",
               (ulong)(uint)((int)((ulong)((long)(this->mSections).
                                                 super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->mSections).
                                                super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 5) *
                            -0x55555555));
      pLVar4 = DefaultLogger::get();
      Logger::debug(pLVar4,(char *)&local_a8);
    }
    return;
  }
  __assert_fail("__null != _buffer && 0 != _fileSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MD5/MD5Parser.cpp"
                ,0x42,"Assimp::MD5::MD5Parser::MD5Parser(char *, unsigned int)");
}

Assistant:

AI_WONT_RETURN void MD5Parser::ReportError (const char* error, unsigned int line)
{
    char szBuffer[1024];
    ::ai_snprintf(szBuffer, 1024, "[MD5] Line %u: %s",line,error);
    throw DeadlyImportError(szBuffer);
}